

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_ori_32_di(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint value;
  
  uVar1 = m68ki_read_imm_32();
  uVar3 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar2 = m68ki_read_imm_16();
  uVar3 = (int)(short)uVar2 + uVar3;
  uVar2 = m68ki_read_32_fc(uVar3,m68ki_address_space | m68ki_cpu.s_flag);
  value = uVar2 | uVar1;
  m68ki_write_32_fc(uVar3,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 0x18;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_ori_32_di(void)
{
	uint src = OPER_I_32();
	uint ea = EA_AY_DI_32();
	uint res = src | m68ki_read_32(ea);

	m68ki_write_32(ea, res);

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}